

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall
wasm::PrintExpressionContents::visitTupleMake(PrintExpressionContents *this,TupleMake *curr)

{
  ostream *stream;
  
  stream = this->o;
  Colors::outputColorCode(stream,"\x1b[35m");
  Colors::outputColorCode(stream,"\x1b[1m");
  std::__ostream_insert<char,std::char_traits<char>>(stream,"tuple.make ",0xb);
  Colors::outputColorCode(stream,"\x1b[0m");
  std::ostream::_M_insert<unsigned_long>((ulong)this->o);
  return;
}

Assistant:

void visitTupleMake(TupleMake* curr) {
    printMedium(o, "tuple.make ");
    o << curr->operands.size();
  }